

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

void __thiscall CInput::HandleJoystickHatMotionEvent(CInput *this,SDL_Event *Event)

{
  byte bVar1;
  int iVar2;
  uint Key;
  undefined4 extraout_var;
  bool *pbVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar2 = (*(this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface[7])();
  if ((CONCAT44(extraout_var,iVar2) != 0) &&
     (*(Uint32 *)(CONCAT44(extraout_var,iVar2) + 0x78) == (Event->display).display)) {
    bVar1 = (Event->display).event;
    uVar4 = (ulong)bVar1;
    if (bVar1 < 2) {
      Key = CJoystick::GetJoystickHatKey((uint)bVar1,(uint)(Event->display).padding1);
      uVar6 = (ulong)Key;
      uVar5 = (ulong)((uint)bVar1 * 8 & 0xff);
      pbVar3 = this->m_aInputState + uVar5 + 0x1b2;
      for (uVar5 = uVar5 | 0x1b2; uVar5 <= uVar4 * 8 + 0x1b9; uVar5 = uVar5 + 1) {
        if ((uVar6 != uVar5) && (*pbVar3 == true)) {
          *pbVar3 = false;
          AddEvent(this,(char *)0x0,(int)uVar5,2);
          uVar4 = (ulong)(Event->display).event;
        }
        pbVar3 = pbVar3 + 1;
      }
      if (-1 < (int)Key) {
        this->m_aInputState[uVar6] = true;
        this->m_aInputCount[uVar6] = (unsigned_short)this->m_InputCounter;
        AddEvent(this,(char *)0x0,Key,1);
        return;
      }
    }
  }
  return;
}

Assistant:

void CInput::HandleJoystickHatMotionEvent(const SDL_Event &Event)
{
	CJoystick *pJoystick = GetActiveJoystick();
	if(!pJoystick || pJoystick->GetInstanceID() != Event.jhat.which)
		return;
	if(Event.jhat.hat >= NUM_JOYSTICK_HATS)
		return;

	const int CurrentKey = CJoystick::GetJoystickHatKey(Event.jhat.hat, Event.jhat.value);

	for(int Key = KEY_JOY_HAT0_LEFTUP + Event.jhat.hat * NUM_JOYSTICK_BUTTONS_PER_HAT; Key <= KEY_JOY_HAT0_RIGHTDOWN + Event.jhat.hat * NUM_JOYSTICK_BUTTONS_PER_HAT; Key++)
	{
		if(Key != CurrentKey && m_aInputState[Key])
		{
			m_aInputState[Key] = false;
			AddEvent(0, Key, IInput::FLAG_RELEASE);
		}
	}

	if(CurrentKey >= 0)
	{
		m_aInputState[CurrentKey] = true;
		m_aInputCount[CurrentKey] = m_InputCounter;
		AddEvent(0, CurrentKey, IInput::FLAG_PRESS);
	}
}